

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ConvertToUnixSlashes(string *path)

{
  bool bVar1;
  undefined1 *puVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  reference pcVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8 [8];
  ulong local_a0;
  size_t size;
  passwd *pw;
  string user;
  size_type idx;
  undefined1 local_58 [8];
  string homeEnv;
  size_type pos;
  char *pos1;
  char *pos0;
  bool hasDoubleSlash;
  char *pathCString;
  string *path_local;
  
  pos1 = (char *)std::__cxx11::string::c_str();
  bVar1 = false;
  homeEnv.field_2._8_8_ = 0;
  pcVar4 = pos1;
  for (; pos = (long)pcVar4 + 1, *pos1 != '\0'; pos1 = pos1 + 1) {
    if ((*pos1 == '\\') && (*(char *)pos != ' ')) {
      puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)path);
      *puVar2 = 0x2f;
    }
    if (((*(char *)pos == '/') && (pcVar4[2] == '/')) && (!bVar1)) {
      bVar1 = true;
    }
    homeEnv.field_2._8_8_ = homeEnv.field_2._8_8_ + 1;
    pcVar4 = (char *)pos;
  }
  if (bVar1) {
    ReplaceString(path,"//","/");
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    if ((*pcVar4 == '~') && ((pcVar4[1] == '/' || (pcVar4[1] == '\0')))) {
      std::__cxx11::string::string((string *)local_58);
      bVar1 = GetEnv("HOME",(string *)local_58);
      if (bVar1) {
        std::__cxx11::string::replace((ulong)path,0,(string *)0x1);
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    else if (*pcVar4 == '~') {
      user.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)path,0xa4cde0);
      std::__cxx11::string::substr((ulong)&pw,(ulong)path);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      size = (size_t)getpwnam(pcVar4);
      if ((passwd *)size != (passwd *)0x0) {
        std::__cxx11::string::replace((ulong)path,0,(char *)user.field_2._8_8_);
      }
      std::__cxx11::string::~string((string *)&pw);
    }
    lVar5 = std::__cxx11::string::c_str();
    local_a0 = std::__cxx11::string::size();
    bVar1 = false;
    if (1 < local_a0) {
      std::__cxx11::string::rbegin();
      pcVar6 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(local_a8);
      bVar1 = *pcVar6 == '/';
    }
    if ((bVar1) && ((local_a0 != 3 || (*(char *)(lVar5 + 1) != ':')))) {
      std::__cxx11::string::resize((ulong)path);
    }
  }
  return;
}

Assistant:

void SystemTools::ConvertToUnixSlashes(std::string& path)
{
  const char* pathCString = path.c_str();
  bool hasDoubleSlash = false;
#ifdef __VMS
  ConvertVMSToUnix(path);
#else
  const char* pos0 = pathCString;
  const char* pos1 = pathCString + 1;
  for (std::string::size_type pos = 0; *pos0; ++pos) {
    // make sure we don't convert an escaped space to a unix slash
    if (*pos0 == '\\' && *pos1 != ' ') {
      path[pos] = '/';
    }

    // Also, reuse the loop to check for slash followed by another slash
    if (*pos1 == '/' && *(pos1 + 1) == '/' && !hasDoubleSlash) {
#ifdef _WIN32
      // However, on windows if the first characters are both slashes,
      // then keep them that way, so that network paths can be handled.
      if (pos > 0) {
        hasDoubleSlash = true;
      }
#else
      hasDoubleSlash = true;
#endif
    }

    pos0++;
    pos1++;
  }

  if (hasDoubleSlash) {
    SystemTools::ReplaceString(path, "//", "/");
  }
#endif
  // remove any trailing slash
  if (!path.empty()) {
    // if there is a tilda ~ then replace it with HOME
    pathCString = path.c_str();
    if (pathCString[0] == '~' &&
        (pathCString[1] == '/' || pathCString[1] == '\0')) {
      std::string homeEnv;
      if (SystemTools::GetEnv("HOME", homeEnv)) {
        path.replace(0, 1, homeEnv);
      }
    }
#ifdef HAVE_GETPWNAM
    else if (pathCString[0] == '~') {
      std::string::size_type idx = path.find_first_of("/\0");
      std::string user = path.substr(1, idx - 1);
      passwd* pw = getpwnam(user.c_str());
      if (pw) {
        path.replace(0, idx, pw->pw_dir);
      }
    }
#endif
    // remove trailing slash if the path is more than
    // a single /
    pathCString = path.c_str();
    size_t size = path.size();
    if (size > 1 && *path.rbegin() == '/') {
      // if it is c:/ then do not remove the trailing slash
      if (!((size == 3 && pathCString[1] == ':'))) {
        path.resize(size - 1);
      }
    }
  }
}